

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::csharp::CSharpGenerator::GenEnumDefaultValue_abi_cxx11_
          (string *__return_storage_ptr__,CSharpGenerator *this,FieldDef *field)

{
  EnumDef *this_00;
  EnumVal *name;
  string *constant;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = (field->value).type.enum_def;
  if (this_00 != (EnumDef *)0x0) {
    constant = &(field->value).constant;
    name = EnumDef::FindByValue(this_00,constant);
    if (name == (EnumVal *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)constant);
    }
    else {
      NamespacedName_abi_cxx11_(&local_48,this,&this_00->super_Definition);
      std::operator+(&local_68,&local_48,".");
      EscapeKeyword(&sStack_88,this,&name->name);
      std::operator+(__return_storage_ptr__,&local_68,&sStack_88);
      std::__cxx11::string::~string((string *)&sStack_88);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("value.type.enum_def",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_csharp.cpp"
                ,0x149,
                "std::string flatbuffers::csharp::CSharpGenerator::GenEnumDefaultValue(const FieldDef &) const"
               );
}

Assistant:

std::string GenEnumDefaultValue(const FieldDef &field) const {
    auto &value = field.value;
    FLATBUFFERS_ASSERT(value.type.enum_def);
    auto &enum_def = *value.type.enum_def;
    auto enum_val = enum_def.FindByValue(value.constant);
    return enum_val ? (NamespacedName(enum_def) + "." + Name(*enum_val))
                    : value.constant;
  }